

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

TilePipelineDesc * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetTilePipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  GraphicsPipelineData *pGVar1;
  char (*in_RCX) [31];
  string msg;
  string local_30;
  
  CheckPipelineReady(this);
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      ).m_Desc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[30]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsTilePipeline()",(char (*) [30])in_RCX);
    in_RCX = (char (*) [31])0x21c;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetTilePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x21c);
    std::__cxx11::string::~string((string *)&local_30);
  }
  pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  if (pGVar1 == (GraphicsPipelineData *)0x0) {
    FormatString<char[26],char[31]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pTilePipelineData != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetTilePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x21d);
    std::__cxx11::string::~string((string *)&local_30);
    pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  }
  return (TilePipelineDesc *)pGVar1;
}

Assistant:

GetTilePipelineDesc() const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsTilePipeline());
        VERIFY_EXPR(m_pTilePipelineData != nullptr);
        return m_pTilePipelineData->Desc;
    }